

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::
VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test::
VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test
          (VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test *this)

{
  VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test *this_local;
  
  VarintErrorCasesWithSizes::VarintErrorCasesWithSizes(&this->super_VarintErrorCasesWithSizes);
  (this->super_VarintErrorCasesWithSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)
       &PTR__VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test_02a14bf0
  ;
  (this->super_VarintErrorCasesWithSizes).
  super_WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_02a14c30;
  return;
}

Assistant:

TEST_P(VarintErrorCasesWithSizes,
       ReadVarint64Error_LeavesValueInInitializedState) {
  VarintErrorCase kVarintErrorCases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintErrorCases_case.bytes, kVarintErrorCases_case.size);
  ArrayInputStream input(buffer_, static_cast<int>(kVarintErrorCases_case.size),
                         kBlockSizes_case);
  CodedInputStream coded_input(&input);

  uint64_t value = 0;
  EXPECT_EQ(kVarintErrorCases_case.can_parse, coded_input.ReadVarint64(&value));
  // While the specific value following a failure is not critical, we do want to
  // ensure that it doesn't get set to an uninitialized value. (This check fails
  // in MSAN mode if value has been set to an uninitialized value.)
  EXPECT_EQ(value, value);
}